

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_QuePush(Cbs2_Que_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = p->nSize;
  if (p->iTail == iVar1) {
    p->nSize = iVar1 * 2;
    if (p->pData == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar1 << 3);
    }
    else {
      piVar2 = (int *)realloc(p->pData,(long)iVar1 << 3);
    }
    p->pData = piVar2;
  }
  iVar1 = p->iTail;
  p->iTail = iVar1 + 1;
  p->pData[iVar1] = iObj;
  return;
}

Assistant:

static inline void Cbs2_QuePush( Cbs2_Que_t * p, int iObj )
{
    if ( p->iTail == p->nSize )
    {
        p->nSize *= 2;
        p->pData = ABC_REALLOC( int, p->pData, p->nSize ); 
    }
    p->pData[p->iTail++] = iObj;
}